

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

S2CellUnion * __thiscall
S2CellUnion::Union(S2CellUnion *__return_storage_ptr__,S2CellUnion *this,S2CellUnion *y)

{
  int iVar1;
  int iVar2;
  vector<S2CellId,_std::allocator<S2CellId>_> local_88;
  S2CellId *local_70;
  S2CellId *local_68;
  __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_60;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_58;
  const_iterator local_50;
  undefined1 local_38 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  S2CellUnion *y_local;
  S2CellUnion *this_local;
  
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)y;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  iVar1 = num_cells(this);
  iVar2 = num_cells((S2CellUnion *)
                    cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38,(long)(iVar1 + iVar2));
  std::vector<S2CellId,_std::allocator<S2CellId>_>::operator=
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38,&this->cell_ids_);
  local_58._M_current =
       (S2CellId *)
       std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                 ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  __gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>::
  __normal_iterator<S2CellId*>
            ((__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>> *)
             &local_50,&local_58);
  local_60._M_current =
       (S2CellId *)
       std::vector<S2CellId,_std::allocator<S2CellId>_>::begin
                 ((vector<S2CellId,_std::allocator<S2CellId>_> *)
                  (cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1));
  local_68 = (S2CellId *)
             std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                       ((vector<S2CellId,_std::allocator<S2CellId>_> *)
                        (cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1));
  local_70 = (S2CellId *)
             std::vector<S2CellId,std::allocator<S2CellId>>::
             insert<__gnu_cxx::__normal_iterator<S2CellId_const*,std::vector<S2CellId,std::allocator<S2CellId>>>,void>
                       ((vector<S2CellId,std::allocator<S2CellId>> *)local_38,local_50,local_60,
                        (__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                         )local_68);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            (&local_88,(vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  S2CellUnion(__return_storage_ptr__,&local_88);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector(&local_88);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

S2CellUnion S2CellUnion::Union(const S2CellUnion& y) const {
  vector<S2CellId> cell_ids;
  cell_ids.reserve(num_cells() + y.num_cells());
  cell_ids = cell_ids_;
  cell_ids.insert(cell_ids.end(), y.cell_ids_.begin(), y.cell_ids_.end());
  return S2CellUnion(std::move(cell_ids));
}